

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processElemDeclIC
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *valueToAdopt;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar3;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
  *this_00;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar4;
  DOMNode *local_48;
  SchemaElementDecl *elemDecl_local;
  MemoryManager *local_38;
  
  valueToAdopt = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0;
  elemDecl_local = elemDecl;
  while (local_48 = &icElem->super_DOMNode, &icElem->super_DOMNode != (DOMNode *)0x0) {
    iVar2 = (*((DOMNode *)&(icElem->super_DOMNode)._vptr_DOMNode)->_vptr_DOMNode[0x18])(icElem);
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),L"key");
    if (bVar1) {
      traverseKey(this,(DOMElement *)local_48,elemDecl_local);
    }
    else {
      iVar2 = (*((DOMNode *)&local_48->_vptr_DOMNode)->_vptr_DOMNode[0x18])(local_48);
      bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar2),
                                (XMLCh *)SchemaSymbols::fgELT_UNIQUE);
      if (bVar1) {
        traverseUnique(this,(DOMElement *)local_48,elemDecl_local);
      }
      else {
        if (valueToAdopt == (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0) {
          local_38 = this->fGrammarPoolMemoryManager;
          valueToAdopt = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)
                         XMemory::operator_new(0x28,local_38);
          ValueVectorOf<xercesc_4_0::DOMElement_*>::ValueVectorOf
                    (valueToAdopt,8,this->fGrammarPoolMemoryManager,false);
        }
        ValueVectorOf<xercesc_4_0::DOMElement_*>::addElement(valueToAdopt,(DOMElement **)&local_48);
      }
    }
    icElem = XUtil::getNextSiblingElementNS
                       (local_48,(XMLCh **)fgIdentityConstraints,
                        (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,3);
  }
  if (valueToAdopt != (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0) {
    pRVar3 = this->fIC_ElementsNS;
    if (pRVar3 == (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   *)0x0) {
      pRVar3 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                *)XMemory::operator_new(0x38,this->fMemoryManager);
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::RefHashTableOf(pRVar3,0xd,this->fMemoryManager);
      this->fIC_ElementsNS = pRVar3;
      this_00 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
                 *)XMemory::operator_new(0x38,this->fMemoryManager);
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
      ::RefHashTableOf(this_00,0x1d,true,this->fMemoryManager);
      this->fIC_NodeListNS = this_00;
      pRVar3 = this->fIC_ElementsNS;
    }
    pVVar4 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(pRVar3,this->fTargetNSURIString);
    this->fIC_Elements = pVVar4;
    if (pVVar4 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      pVVar4 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
               XMemory::operator_new(0x28,this->fMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                (pVVar4,8,this->fMemoryManager,false);
      this->fIC_Elements = pVVar4;
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fIC_ElementsNS,this->fTargetNSURIString,pVVar4);
    }
    RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>::
    put(this->fIC_NodeListNS,elemDecl_local,valueToAdopt);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(this->fIC_Elements,&elemDecl_local);
  }
  return;
}

Assistant:

void TraverseSchema::processElemDeclIC(DOMElement* const icElem,
                                       SchemaElementDecl* const elemDecl)
{
    // key/keyref/unique processing
    ValueVectorOf<DOMElement*>* icNodes = 0;
    DOMElement* ic = icElem;
    while (ic != 0) {

        if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_KEY)) {
            traverseKey(ic, elemDecl);
        }
        else if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_UNIQUE)) {
            traverseUnique(ic, elemDecl);
        }
        else {

            if (!icNodes) {
                icNodes = new (fGrammarPoolMemoryManager) ValueVectorOf<DOMElement*>(8, fGrammarPoolMemoryManager);
            }

            icNodes->addElement(ic);
        }

        ic = XUtil::getNextSiblingElementNS(
            ic, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);
    }

    if (icNodes) {

        if (!fIC_ElementsNS) {

            fIC_ElementsNS = new (fMemoryManager) RefHashTableOf<ElemVector>(13, fMemoryManager);
            fIC_NodeListNS = new (fMemoryManager) RefHashTableOf<ValueVectorOf<DOMElement*>, PtrHasher>(29, true, fMemoryManager);
        }

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);
        if (!fIC_Elements) {
            fIC_Elements = new (fMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fMemoryManager);
            fIC_ElementsNS->put((void*) fTargetNSURIString, fIC_Elements);
        }

        fIC_NodeListNS->put(elemDecl, icNodes);
        fIC_Elements->addElement(elemDecl);
    }
}